

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O1

void annEnclCube(ANNpointArray pa,ANNidxArray pidx,int n,int dim,ANNorthRect *bnds)

{
  ANNpoint pAVar1;
  ANNpoint pAVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  annEnclRect(pa,pidx,n,dim,bnds);
  if (dim < 1) {
    dVar4 = 0.0;
  }
  else {
    uVar3 = 0;
    dVar5 = 0.0;
    do {
      dVar4 = bnds->hi[uVar3] - bnds->lo[uVar3];
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
      }
      uVar3 = uVar3 + 1;
      dVar5 = dVar4;
    } while ((uint)dim != uVar3);
  }
  if (0 < dim) {
    pAVar1 = bnds->lo;
    pAVar2 = bnds->hi;
    uVar3 = 0;
    do {
      dVar5 = pAVar1[uVar3];
      dVar6 = (dVar4 - (pAVar2[uVar3] - dVar5)) * 0.5;
      pAVar1[uVar3] = dVar5 - dVar6;
      pAVar2[uVar3] = dVar6 + pAVar2[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)dim != uVar3);
  }
  return;
}

Assistant:

void annEnclCube(       // compute smallest enclosing cube
    ANNpointArray pa,   // point array
    ANNidxArray pidx,   // point indices
    int n,              // number of points
    int dim,            // dimension
    ANNorthRect &bnds)  // bounding cube (returned)
{
    int d;
    // compute smallest enclosing rect
    annEnclRect(pa, pidx, n, dim, bnds);

    ANNcoord max_len = 0;        // max length of any side
    for (d = 0; d < dim; d++) {  // determine max side length
        ANNcoord len = bnds.hi[d] - bnds.lo[d];
        if (len > max_len) {  // update max_len if longest
            max_len = len;
        }
    }
    for (d = 0; d < dim; d++) {  // grow sides to match max
        ANNcoord len = bnds.hi[d] - bnds.lo[d];
        ANNcoord half_diff = (max_len - len) / 2;
        bnds.lo[d] -= half_diff;
        bnds.hi[d] += half_diff;
    }
}